

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O2

void QTest::setFailed(bool failed)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool ok;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (setFailed(bool)::fatalFailure == '\0') {
    iVar2 = __cxa_guard_acquire(&setFailed(bool)::fatalFailure);
    if (iVar2 != 0) {
      cVar1 = qEnvironmentVariableIsSet("QTEST_FATAL_FAIL");
      if (cVar1 == '\0') {
        setFailed::fatalFailure = false;
      }
      else {
        local_19 = true;
        iVar2 = qEnvironmentVariableIntValue("QTEST_FATAL_FAIL",&local_19);
        setFailed::fatalFailure = (bool)(iVar2 != 0 & local_19);
      }
      __cxa_guard_release(&setFailed(bool)::fatalFailure);
    }
  }
  if ((failed) && (setFailed::fatalFailure == true)) {
    std::terminate();
  }
  Internal::failed = failed;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void setFailed(bool failed)
    {
        static const bool fatalFailure = []() {
            static const char * const environmentVar = "QTEST_FATAL_FAIL";
            if (!qEnvironmentVariableIsSet(environmentVar))
                return false;

            bool ok;
            const int fatal = qEnvironmentVariableIntValue(environmentVar, &ok);
            return ok && fatal;
        }();

        if (failed && fatalFailure)
            std::terminate();
        Internal::failed = failed;
    }